

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::priv::(anonymous_namespace)::BadFastHash,_std::equal_to<int>,_std::allocator<int>_>
::rehash_and_grow_if_necessary
          (raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::priv::(anonymous_namespace)::BadFastHash,_std::equal_to<int>,_std::allocator<int>_>
           *this)

{
  ulong uVar1;
  size_t sVar2;
  
  if (this->capacity_ == 0) {
    sVar2 = 1;
  }
  else {
    uVar1 = this->size_;
    sVar2 = CapacityToGrowth(this->capacity_);
    if (uVar1 <= sVar2 >> 1) {
      drop_deletes_without_resize(this);
      return;
    }
    sVar2 = this->capacity_ * 2 + 1;
  }
  resize(this,sVar2);
  return;
}

Assistant:

void rehash_and_grow_if_necessary() {
        if (capacity_ == 0) {
            resize(1);
        } else if (size() <= CapacityToGrowth(capacity()) / 2) {
            // Squash DELETED without growing if there is enough capacity.
            drop_deletes_without_resize();
        } else {
            // Otherwise grow the container.
            resize(capacity_ * 2 + 1);
        }
    }